

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

qpTestResult __thiscall
gl4cts::ClipControlDepthModeOneToOneTest::ValidateFramebuffer
          (ClipControlDepthModeOneToOneTest *this,Context *context)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestContext *this_00;
  float fVar6;
  PixelBufferAccess local_168;
  undefined4 local_13c;
  PixelBufferAccess local_138;
  PixelBufferAccess local_110;
  deUint32 local_e4;
  float local_e0;
  int local_dc;
  float xCoord;
  int x;
  float yCoord;
  int y;
  TestLog *log;
  TextureLevel referenceDepthFrame;
  TextureLevel renderedDepthFrame;
  TextureFormat depthFormat;
  undefined1 local_60 [8];
  Surface referenceColorFrame;
  Surface renderedColorFrame;
  GLuint viewportH;
  GLuint viewportW;
  RenderTarget *renderTarget;
  Context *context_local;
  ClipControlDepthModeOneToOneTest *this_local;
  
  pRVar5 = deqp::Context::getRenderContext(context);
  iVar2 = (*pRVar5->_vptr_RenderContext[4])();
  iVar3 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar2));
  iVar2 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var,iVar2));
  tcu::Surface::Surface((Surface *)&referenceColorFrame.m_pixels.m_cap,iVar3,iVar2);
  tcu::Surface::Surface((Surface *)local_60,iVar3,iVar2);
  tcu::TextureFormat::TextureFormat
            ((TextureFormat *)((long)&renderedDepthFrame.m_data.m_cap + 4),D,FLOAT);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&referenceDepthFrame.m_data.m_cap,
             (TextureFormat *)((long)&renderedDepthFrame.m_data.m_cap + 4),iVar3,iVar2,1);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&log,(TextureFormat *)((long)&renderedDepthFrame.m_data.m_cap + 4),
             iVar3,iVar2,1);
  this_00 = deqp::Context::getTestContext(context);
  _yCoord = tcu::TestContext::getLog(this_00);
  x = 0;
  while( true ) {
    iVar2 = x;
    iVar3 = tcu::Surface::getHeight((Surface *)&referenceColorFrame.m_pixels.m_cap);
    if (iVar3 <= iVar2) break;
    fVar6 = (float)x;
    iVar2 = tcu::Surface::getHeight((Surface *)&referenceColorFrame.m_pixels.m_cap);
    xCoord = fVar6 / (float)iVar2;
    local_dc = 0;
    while( true ) {
      iVar2 = local_dc;
      iVar3 = tcu::Surface::getWidth((Surface *)&referenceColorFrame.m_pixels.m_cap);
      if (iVar3 <= iVar2) break;
      fVar6 = (float)local_dc;
      iVar4 = tcu::Surface::getWidth((Surface *)&referenceColorFrame.m_pixels.m_cap);
      iVar3 = x;
      iVar2 = local_dc;
      local_e0 = fVar6 / (float)iVar4;
      local_e4 = (deUint32)tcu::RGBA::green();
      tcu::Surface::setPixel((Surface *)local_60,iVar2,iVar3,(RGBA)local_e4);
      tcu::TextureLevel::getAccess(&local_110,(TextureLevel *)&log);
      tcu::PixelBufferAccess::setPixDepth(&local_110,(local_e0 + xCoord) * 0.5,local_dc,x,0);
      local_dc = local_dc + 1;
    }
    x = x + 1;
  }
  pRVar5 = deqp::Context::getRenderContext(context);
  tcu::Surface::getAccess(&local_138,(Surface *)&referenceColorFrame.m_pixels.m_cap);
  glu::readPixels(pRVar5,0,0,&local_138);
  bVar1 = tcu::fuzzyCompare(_yCoord,"Result","Color image comparison result",(Surface *)local_60,
                            (Surface *)&referenceColorFrame.m_pixels.m_cap,0.05,COMPARE_LOG_RESULT);
  if (bVar1) {
    pRVar5 = deqp::Context::getRenderContext(context);
    tcu::TextureLevel::getAccess(&local_168,(TextureLevel *)&referenceDepthFrame.m_data.m_cap);
    glu::readPixels(pRVar5,0,0,&local_168);
    bVar1 = ClipControlRenderBaseTest::fuzzyDepthCompare
                      (&this->super_ClipControlRenderBaseTest,_yCoord,"Result",
                       "Depth image comparison result",(TextureLevel *)&log,
                       (TextureLevel *)&referenceDepthFrame.m_data.m_cap,0.05,(TextureLevel *)0x0);
    if (bVar1) {
      this_local._4_4_ = QP_TEST_RESULT_PASS;
    }
    else {
      this_local._4_4_ = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_local._4_4_ = QP_TEST_RESULT_FAIL;
  }
  local_13c = 1;
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&log);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&referenceDepthFrame.m_data.m_cap);
  tcu::Surface::~Surface((Surface *)local_60);
  tcu::Surface::~Surface((Surface *)&referenceColorFrame.m_pixels.m_cap);
  return this_local._4_4_;
}

Assistant:

qpTestResult ValidateFramebuffer(deqp::Context& context)
	{
		const tcu::RenderTarget& renderTarget = context.getRenderContext().getRenderTarget();
		glw::GLuint				 viewportW	= renderTarget.getWidth();
		glw::GLuint				 viewportH	= renderTarget.getHeight();
		tcu::Surface			 renderedColorFrame(viewportW, viewportH);
		tcu::Surface			 referenceColorFrame(viewportW, viewportH);
		tcu::TextureFormat		 depthFormat(tcu::TextureFormat::D, tcu::TextureFormat::FLOAT);
		tcu::TextureLevel		 renderedDepthFrame(depthFormat, viewportW, viewportH);
		tcu::TextureLevel		 referenceDepthFrame(depthFormat, viewportW, viewportH);

		tcu::TestLog& log = context.getTestContext().getLog();

		for (int y = 0; y < renderedColorFrame.getHeight(); y++)
		{
			float yCoord = (float)(y) / (float)renderedColorFrame.getHeight();
			for (int x = 0; x < renderedColorFrame.getWidth(); x++)
			{
				float xCoord = (float)(x) / (float)renderedColorFrame.getWidth();

				referenceColorFrame.setPixel(x, y, tcu::RGBA::green());
				referenceDepthFrame.getAccess().setPixDepth((xCoord + yCoord) * 0.5f, x, y);
			}
		}

		glu::readPixels(context.getRenderContext(), 0, 0, renderedColorFrame.getAccess());
		if (!tcu::fuzzyCompare(log, "Result", "Color image comparison result", referenceColorFrame, renderedColorFrame,
							   0.05f, tcu::COMPARE_LOG_RESULT))
		{

			return QP_TEST_RESULT_FAIL;
		}
		glu::readPixels(context.getRenderContext(), 0, 0, renderedDepthFrame.getAccess());
		if (!fuzzyDepthCompare(log, "Result", "Depth image comparison result", referenceDepthFrame, renderedDepthFrame,
							   0.05f))
		{

			return QP_TEST_RESULT_FAIL;
		}

		return QP_TEST_RESULT_PASS;
	}